

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O0

void __thiscall DynamicKReach::construct(DynamicKReach *this)

{
  uint uVar1;
  bool bVar2;
  degree_t dVar3;
  reference pvVar4;
  const_reference pvVar5;
  mapped_type *pmVar6;
  allocator<unsigned_char> local_39;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  uint local_1c;
  uint local_18;
  uint cur;
  uint deg;
  vertex_t i;
  DynamicKReach *this_local;
  
  _deg = this;
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::clear(&this->index_);
  set_degree(this);
  for (cur = 0; uVar1 = cur, dVar3 = Graph::num_vertices(this->graph_), uVar1 < dVar3; cur = cur + 1
      ) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->degree_,(ulong)cur)
    ;
    std::
    priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
    ::emplace<unsigned_int&,unsigned_int&>
              ((priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
                *)&this->quedeg_,pvVar4,&cur);
  }
  while (bVar2 = std::
                 priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
                 ::empty(&this->quedeg_), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar5 = std::
             priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
             ::top(&this->quedeg_);
    local_18 = pvVar5->first;
    pvVar5 = std::
             priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
             ::top(&this->quedeg_);
    local_1c = pvVar5->second;
    std::
    priority_queue<std::pair<unsigned_int,_unsigned_int>,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>_>
    ::pop(&this->quedeg_);
    if ((local_18 != 0) &&
       (pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           (&this->degree_,(ulong)local_1c), uVar1 = local_18, *pvVar4 != 0)) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         (&this->degree_,(ulong)local_1c);
      if (uVar1 == *pvVar4) {
        dVar3 = Graph::num_vertices(this->graph_);
        std::allocator<unsigned_char>::allocator(&local_39);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_38,(ulong)dVar3,"?13DynamicKReach",&local_39);
        pmVar6 = std::
                 unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::operator[](&this->index_,&local_1c);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(pmVar6,&local_38);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
        std::allocator<unsigned_char>::~allocator(&local_39);
        uVar1 = local_1c;
        pmVar6 = std::
                 unordered_map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::at(&this->index_,&local_1c);
        construct_bfs(this,uVar1,pmVar6);
        cover(this,local_1c);
      }
      else {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           (&this->degree_,(ulong)local_1c);
        std::
        priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
        ::emplace<unsigned_int&,unsigned_int&>
                  ((priority_queue<std::pair<unsigned_int,unsigned_int>,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::less<std::pair<unsigned_int,unsigned_int>>>
                    *)&this->quedeg_,pvVar4,&local_1c);
      }
    }
  }
  return;
}

Assistant:

void DynamicKReach::construct() {
    index_.clear();
    set_degree();
    for (vertex_t i = 0; i < graph_.num_vertices(); ++i){
        quedeg_.emplace(degree_.at(i), i);
    }
    while (!quedeg_.empty()){
        auto deg = quedeg_.top().first;
        auto cur = quedeg_.top().second;
        quedeg_.pop();
        if (deg <= 0 || degree_.at(cur) <= 0) {
            continue;
        }
        if (deg != degree_.at(cur)) {
            quedeg_.emplace(degree_.at(cur), cur);
            continue;
        }
        index_[cur] = vector<distance_t>(graph_.num_vertices(), INF8);
        construct_bfs(cur, index_.at(cur));
        cover(cur);
    }
}